

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

bool __thiscall pybind11::function::is_cpp_function(function *this)

{
  int iVar1;
  PyObject *pPVar2;
  
  pPVar2 = (this->super_object).super_handle.m_ptr;
  if (pPVar2 != (PyObject *)0x0) {
    if (pPVar2->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar2 = (PyObject *)pPVar2[1].ob_refcnt;
    }
    if (pPVar2->ob_type == (PyTypeObject *)&PyMethod_Type) {
      pPVar2 = (PyObject *)pPVar2[1].ob_refcnt;
    }
  }
  if (pPVar2 != (PyObject *)0x0) {
    if (pPVar2->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar1 = PyType_IsSubtype(pPVar2->ob_type,&PyCFunction_Type);
      return iVar1 != 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool is_cpp_function() const {
        handle fun = detail::get_function(m_ptr);
        return fun && PyCFunction_Check(fun.ptr());
    }